

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

xmlChar * xmlBuildURI(xmlChar *URI,xmlChar *base)

{
  int iVar1;
  xmlURIPtr uri;
  xmlChar *pxVar2;
  xmlURIPtr uri_00;
  xmlURIPtr uri_01;
  char *pcVar3;
  size_t sVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  xmlURIPtr pxVar8;
  long lVar9;
  bool bVar10;
  
  if (URI == (xmlChar *)0x0) {
    bVar10 = false;
LAB_0018ccd0:
    uri = (xmlURIPtr)0x0;
LAB_0018ccf7:
    if (!bVar10) {
LAB_0018cdd5:
      pxVar2 = (xmlChar *)0x0;
      goto LAB_0018cdd8;
    }
    if ((uri != (xmlURIPtr)0x0) && (uri->scheme != (char *)0x0)) {
      pxVar2 = xmlStrdup(URI);
      goto LAB_0018cdd8;
    }
    if (base == (xmlChar *)0x0) {
      bVar10 = false;
      uri_00 = (xmlURIPtr)0x0;
    }
    else {
      uri_00 = (xmlURIPtr)(*xmlMalloc)(0x58);
      if (uri_00 == (xmlURIPtr)0x0) {
        xmlURIErrMemory("creating URI structure\n");
        uri_00 = (xmlURIPtr)0x0;
      }
      else {
        uri_00->fragment = (char *)0x0;
        *(undefined8 *)&uri_00->cleanup = 0;
        uri_00->path = (char *)0x0;
        uri_00->query = (char *)0x0;
        uri_00->user = (char *)0x0;
        *(undefined8 *)&uri_00->port = 0;
        uri_00->authority = (char *)0x0;
        uri_00->server = (char *)0x0;
        uri_00->scheme = (char *)0x0;
        uri_00->opaque = (char *)0x0;
        uri_00->query_raw = (char *)0x0;
      }
      if (uri_00 == (xmlURIPtr)0x0) goto LAB_0018cdd5;
      iVar1 = xmlParse3986URIReference(uri_00,(char *)base);
      bVar10 = iVar1 == 0;
    }
    if (bVar10) {
      if (uri != (xmlURIPtr)0x0) {
        uri_01 = (xmlURIPtr)(*xmlMalloc)(0x58);
        if (uri_01 == (xmlURIPtr)0x0) {
          xmlURIErrMemory("creating URI structure\n");
          uri_01 = (xmlURIPtr)0x0;
        }
        else {
          uri_01->fragment = (char *)0x0;
          *(undefined8 *)&uri_01->cleanup = 0;
          uri_01->path = (char *)0x0;
          uri_01->query = (char *)0x0;
          uri_01->user = (char *)0x0;
          *(undefined8 *)&uri_01->port = 0;
          uri_01->authority = (char *)0x0;
          uri_01->server = (char *)0x0;
          uri_01->scheme = (char *)0x0;
          uri_01->opaque = (char *)0x0;
          uri_01->query_raw = (char *)0x0;
        }
        if (uri_01 == (xmlURIPtr)0x0) {
          pxVar2 = (xmlChar *)0x0;
          goto LAB_0018cddb;
        }
        pxVar8 = uri;
        if (uri->scheme == (char *)0x0) {
          pxVar8 = uri_01;
          if (((uri->path == (char *)0x0) && (uri->authority == (char *)0x0)) &&
             (uri->server == (char *)0x0)) {
            if (uri_00->scheme != (char *)0x0) {
              pcVar3 = (*xmlMemStrdup)(uri_00->scheme);
              uri_01->scheme = pcVar3;
            }
            if (uri_00->authority == (char *)0x0) {
              if (uri_00->server == (char *)0x0) {
                if (uri_00->port != -1) goto LAB_0018d030;
              }
              else {
                pcVar3 = (*xmlMemStrdup)(uri_00->server);
                uri_01->server = pcVar3;
              }
              if (uri_00->user != (char *)0x0) {
                pcVar3 = (*xmlMemStrdup)(uri_00->user);
                uri_01->user = pcVar3;
              }
              uri_01->port = uri_00->port;
            }
            else {
              pcVar3 = (*xmlMemStrdup)(uri_00->authority);
              uri_01->authority = pcVar3;
            }
LAB_0018d030:
            if (uri_00->path != (char *)0x0) {
              pcVar3 = (*xmlMemStrdup)(uri_00->path);
              uri_01->path = pcVar3;
            }
            pcVar3 = uri->query_raw;
            lVar9 = 0x50;
            if (pcVar3 == (char *)0x0) {
              pcVar3 = uri->query;
              if (pcVar3 != (char *)0x0) {
                lVar9 = 0x38;
                goto LAB_0018d07e;
              }
              pcVar3 = uri_00->query_raw;
              if (pcVar3 != (char *)0x0) goto LAB_0018d07e;
              pcVar3 = uri_00->query;
              lVar9 = 0x38;
              if (pcVar3 != (char *)0x0) goto LAB_0018d07e;
            }
            else {
LAB_0018d07e:
              pcVar3 = (*xmlMemStrdup)(pcVar3);
              *(char **)((long)&uri_01->scheme + lVar9) = pcVar3;
            }
            if (uri->fragment != (char *)0x0) {
              pcVar3 = (*xmlMemStrdup)(uri->fragment);
              uri_01->fragment = pcVar3;
            }
          }
          else {
            if (uri_00->scheme != (char *)0x0) {
              pcVar3 = (*xmlMemStrdup)(uri_00->scheme);
              uri_01->scheme = pcVar3;
            }
            pcVar3 = uri->query_raw;
            lVar9 = 0x50;
            if (pcVar3 == (char *)0x0) {
              pcVar3 = uri->query;
              lVar9 = 0x38;
              if (pcVar3 != (char *)0x0) goto LAB_0018ced8;
            }
            else {
LAB_0018ced8:
              pcVar3 = (*xmlMemStrdup)(pcVar3);
              *(char **)((long)&uri_01->scheme + lVar9) = pcVar3;
            }
            if (uri->fragment != (char *)0x0) {
              pcVar3 = (*xmlMemStrdup)(uri->fragment);
              uri_01->fragment = pcVar3;
            }
            if (uri->authority == (char *)0x0) {
              if (uri->server != (char *)0x0) {
                pcVar3 = (*xmlMemStrdup)(uri->server);
                uri_01->server = pcVar3;
                if (uri->user != (char *)0x0) {
                  pcVar3 = (*xmlMemStrdup)(uri->user);
                  uri_01->user = pcVar3;
                }
                uri_01->port = uri->port;
                goto LAB_0018cf11;
              }
              if (uri_00->authority == (char *)0x0) {
                if (uri_00->server == (char *)0x0) {
                  if (uri_00->port != -1) goto LAB_0018d0b5;
                }
                else {
                  pcVar3 = (*xmlMemStrdup)(uri_00->server);
                  uri_01->server = pcVar3;
                }
                if (uri_00->user != (char *)0x0) {
                  pcVar3 = (*xmlMemStrdup)(uri_00->user);
                  uri_01->user = pcVar3;
                }
                uri_01->port = uri_00->port;
              }
              else {
                pcVar3 = (*xmlMemStrdup)(uri_00->authority);
                uri_01->authority = pcVar3;
              }
LAB_0018d0b5:
              pcVar3 = uri->path;
              iVar1 = 2;
              if (pcVar3 == (char *)0x0) {
LAB_0018d0de:
                if (uri_00->path != (char *)0x0) {
                  sVar4 = strlen(uri_00->path);
                  iVar1 = iVar1 + (int)sVar4;
                }
                pcVar3 = (char *)(*xmlMallocAtomic)((long)iVar1);
                uri_01->path = pcVar3;
                if (pcVar3 == (char *)0x0) {
                  xmlURIErrMemory("resolving URI against base\n");
                  pxVar2 = (xmlChar *)0x0;
                  goto LAB_0018cdde;
                }
                *pcVar3 = '\0';
                iVar1 = 0;
                if ((uri_00->path != (char *)0x0) &&
                   (pcVar3 = uri_00->path, iVar1 = 0, *pcVar3 != '\0')) {
                  iVar1 = 0;
                  uVar6 = 0;
                  do {
                    pcVar3 = pcVar3 + (int)uVar6;
                    iVar7 = 0;
                    while( true ) {
                      if (*pcVar3 == '\0') goto LAB_0018d179;
                      if (*pcVar3 == '/') break;
                      iVar7 = iVar7 + -1;
                      pcVar3 = pcVar3 + 1;
                    }
                    if (iVar1 <= (int)(uVar6 - iVar7)) {
                      lVar9 = (long)iVar1;
                      iVar1 = -iVar1;
                      do {
                        uri_01->path[lVar9] = uri_00->path[lVar9];
                        lVar9 = lVar9 + 1;
                        iVar1 = iVar1 + -1;
                      } while (~uVar6 + iVar7 != iVar1);
                      iVar1 = -iVar1;
                    }
                    uVar6 = (uVar6 - iVar7) + 1;
                    pcVar3 = uri_00->path;
                  } while (pcVar3[(int)uVar6] != '\0');
                }
LAB_0018d179:
                uri_01->path[iVar1] = '\0';
                if ((uri->path != (char *)0x0) && (*uri->path != '\0')) {
                  if (iVar1 == 0) {
                    if (uri_00->server == (char *)0x0) {
                      iVar1 = 0;
                    }
                    else {
                      uri_01->path[iVar1] = '/';
                      iVar1 = 1;
                    }
                  }
                  cVar5 = *uri->path;
                  if (cVar5 != '\0') {
                    lVar9 = 0;
                    do {
                      uri_01->path[lVar9 + iVar1] = cVar5;
                      cVar5 = uri->path[lVar9 + 1];
                      lVar9 = lVar9 + 1;
                    } while (cVar5 != '\0');
                    iVar1 = iVar1 + (int)lVar9;
                  }
                }
                uri_01->path[iVar1] = '\0';
                xmlNormalizeURIPath(uri_01->path);
                goto LAB_0018ce91;
              }
              if (*pcVar3 != '/') {
                if (pcVar3 != (char *)0x0) {
                  sVar4 = strlen(pcVar3);
                  iVar1 = (int)sVar4 + 2;
                }
                goto LAB_0018d0de;
              }
            }
            else {
              pcVar3 = (*xmlMemStrdup)(uri->authority);
              uri_01->authority = pcVar3;
LAB_0018cf11:
              pcVar3 = uri->path;
              if (pcVar3 == (char *)0x0) goto LAB_0018ce91;
            }
            pcVar3 = (*xmlMemStrdup)(pcVar3);
            uri_01->path = pcVar3;
          }
        }
LAB_0018ce91:
        pxVar2 = xmlSaveUri(pxVar8);
        goto LAB_0018cdde;
      }
      if (uri_00->fragment != (char *)0x0) {
        (*xmlFree)(uri_00->fragment);
        uri_00->fragment = (char *)0x0;
      }
      pxVar2 = xmlSaveUri(uri_00);
LAB_0018ce50:
      uri = (xmlURIPtr)0x0;
    }
    else {
      if (uri == (xmlURIPtr)0x0) {
        pxVar2 = (xmlChar *)0x0;
        goto LAB_0018ce50;
      }
      pxVar2 = xmlSaveUri(uri);
    }
  }
  else {
    if (*URI == '\0') {
      bVar10 = true;
      goto LAB_0018ccd0;
    }
    uri = (xmlURIPtr)(*xmlMalloc)(0x58);
    if (uri == (xmlURIPtr)0x0) {
      xmlURIErrMemory("creating URI structure\n");
      uri = (xmlURIPtr)0x0;
    }
    else {
      uri->fragment = (char *)0x0;
      *(undefined8 *)&uri->cleanup = 0;
      uri->path = (char *)0x0;
      uri->query = (char *)0x0;
      uri->user = (char *)0x0;
      *(undefined8 *)&uri->port = 0;
      uri->authority = (char *)0x0;
      uri->server = (char *)0x0;
      uri->scheme = (char *)0x0;
      uri->opaque = (char *)0x0;
      uri->query_raw = (char *)0x0;
    }
    if (uri != (xmlURIPtr)0x0) {
      iVar1 = xmlParse3986URIReference(uri,(char *)URI);
      bVar10 = iVar1 == 0;
      goto LAB_0018ccf7;
    }
    pxVar2 = (xmlChar *)0x0;
    uri = (xmlURIPtr)0x0;
LAB_0018cdd8:
    uri_00 = (xmlURIPtr)0x0;
  }
LAB_0018cddb:
  uri_01 = (xmlURIPtr)0x0;
LAB_0018cdde:
  if (uri != (xmlURIPtr)0x0) {
    xmlFreeURI(uri);
  }
  if (uri_00 != (xmlURIPtr)0x0) {
    xmlFreeURI(uri_00);
  }
  if (uri_01 != (xmlURIPtr)0x0) {
    xmlFreeURI(uri_01);
  }
  return pxVar2;
}

Assistant:

xmlChar *
xmlBuildURI(const xmlChar *URI, const xmlChar *base) {
    xmlChar *val = NULL;
    int ret, len, indx, cur, out;
    xmlURIPtr ref = NULL;
    xmlURIPtr bas = NULL;
    xmlURIPtr res = NULL;

    /*
     * 1) The URI reference is parsed into the potential four components and
     *    fragment identifier, as described in Section 4.3.
     *
     *    NOTE that a completely empty URI is treated by modern browsers
     *    as a reference to "." rather than as a synonym for the current
     *    URI.  Should we do that here?
     */
    if (URI == NULL)
	ret = -1;
    else {
	if (*URI) {
	    ref = xmlCreateURI();
	    if (ref == NULL)
		goto done;
	    ret = xmlParseURIReference(ref, (const char *) URI);
	}
	else
	    ret = 0;
    }
    if (ret != 0)
	goto done;
    if ((ref != NULL) && (ref->scheme != NULL)) {
	/*
	 * The URI is absolute don't modify.
	 */
	val = xmlStrdup(URI);
	goto done;
    }
    if (base == NULL)
	ret = -1;
    else {
	bas = xmlCreateURI();
	if (bas == NULL)
	    goto done;
	ret = xmlParseURIReference(bas, (const char *) base);
    }
    if (ret != 0) {
	if (ref)
	    val = xmlSaveUri(ref);
	goto done;
    }
    if (ref == NULL) {
	/*
	 * the base fragment must be ignored
	 */
	if (bas->fragment != NULL) {
	    xmlFree(bas->fragment);
	    bas->fragment = NULL;
	}
	val = xmlSaveUri(bas);
	goto done;
    }

    /*
     * 2) If the path component is empty and the scheme, authority, and
     *    query components are undefined, then it is a reference to the
     *    current document and we are done.  Otherwise, the reference URI's
     *    query and fragment components are defined as found (or not found)
     *    within the URI reference and not inherited from the base URI.
     *
     *    NOTE that in modern browsers, the parsing differs from the above
     *    in the following aspect:  the query component is allowed to be
     *    defined while still treating this as a reference to the current
     *    document.
     */
    res = xmlCreateURI();
    if (res == NULL)
	goto done;
    if ((ref->scheme == NULL) && (ref->path == NULL) &&
	((ref->authority == NULL) && (ref->server == NULL))) {
	if (bas->scheme != NULL)
	    res->scheme = xmlMemStrdup(bas->scheme);
	if (bas->authority != NULL)
	    res->authority = xmlMemStrdup(bas->authority);
	else if ((bas->server != NULL) || (bas->port == -1)) {
	    if (bas->server != NULL)
		res->server = xmlMemStrdup(bas->server);
	    if (bas->user != NULL)
		res->user = xmlMemStrdup(bas->user);
	    res->port = bas->port;
	}
	if (bas->path != NULL)
	    res->path = xmlMemStrdup(bas->path);
	if (ref->query_raw != NULL)
	    res->query_raw = xmlMemStrdup (ref->query_raw);
	else if (ref->query != NULL)
	    res->query = xmlMemStrdup(ref->query);
	else if (bas->query_raw != NULL)
	    res->query_raw = xmlMemStrdup(bas->query_raw);
	else if (bas->query != NULL)
	    res->query = xmlMemStrdup(bas->query);
	if (ref->fragment != NULL)
	    res->fragment = xmlMemStrdup(ref->fragment);
	goto step_7;
    }

    /*
     * 3) If the scheme component is defined, indicating that the reference
     *    starts with a scheme name, then the reference is interpreted as an
     *    absolute URI and we are done.  Otherwise, the reference URI's
     *    scheme is inherited from the base URI's scheme component.
     */
    if (ref->scheme != NULL) {
	val = xmlSaveUri(ref);
	goto done;
    }
    if (bas->scheme != NULL)
	res->scheme = xmlMemStrdup(bas->scheme);

    if (ref->query_raw != NULL)
	res->query_raw = xmlMemStrdup(ref->query_raw);
    else if (ref->query != NULL)
	res->query = xmlMemStrdup(ref->query);
    if (ref->fragment != NULL)
	res->fragment = xmlMemStrdup(ref->fragment);

    /*
     * 4) If the authority component is defined, then the reference is a
     *    network-path and we skip to step 7.  Otherwise, the reference
     *    URI's authority is inherited from the base URI's authority
     *    component, which will also be undefined if the URI scheme does not
     *    use an authority component.
     */
    if ((ref->authority != NULL) || (ref->server != NULL)) {
	if (ref->authority != NULL)
	    res->authority = xmlMemStrdup(ref->authority);
	else {
	    res->server = xmlMemStrdup(ref->server);
	    if (ref->user != NULL)
		res->user = xmlMemStrdup(ref->user);
            res->port = ref->port;
	}
	if (ref->path != NULL)
	    res->path = xmlMemStrdup(ref->path);
	goto step_7;
    }
    if (bas->authority != NULL)
	res->authority = xmlMemStrdup(bas->authority);
    else if ((bas->server != NULL) || (bas->port == -1)) {
	if (bas->server != NULL)
	    res->server = xmlMemStrdup(bas->server);
	if (bas->user != NULL)
	    res->user = xmlMemStrdup(bas->user);
	res->port = bas->port;
    }

    /*
     * 5) If the path component begins with a slash character ("/"), then
     *    the reference is an absolute-path and we skip to step 7.
     */
    if ((ref->path != NULL) && (ref->path[0] == '/')) {
	res->path = xmlMemStrdup(ref->path);
	goto step_7;
    }


    /*
     * 6) If this step is reached, then we are resolving a relative-path
     *    reference.  The relative path needs to be merged with the base
     *    URI's path.  Although there are many ways to do this, we will
     *    describe a simple method using a separate string buffer.
     *
     * Allocate a buffer large enough for the result string.
     */
    len = 2; /* extra / and 0 */
    if (ref->path != NULL)
	len += strlen(ref->path);
    if (bas->path != NULL)
	len += strlen(bas->path);
    res->path = (char *) xmlMallocAtomic(len);
    if (res->path == NULL) {
        xmlURIErrMemory("resolving URI against base\n");
	goto done;
    }
    res->path[0] = 0;

    /*
     * a) All but the last segment of the base URI's path component is
     *    copied to the buffer.  In other words, any characters after the
     *    last (right-most) slash character, if any, are excluded.
     */
    cur = 0;
    out = 0;
    if (bas->path != NULL) {
	while (bas->path[cur] != 0) {
	    while ((bas->path[cur] != 0) && (bas->path[cur] != '/'))
		cur++;
	    if (bas->path[cur] == 0)
		break;

	    cur++;
	    while (out < cur) {
		res->path[out] = bas->path[out];
		out++;
	    }
	}
    }
    res->path[out] = 0;

    /*
     * b) The reference's path component is appended to the buffer
     *    string.
     */
    if (ref->path != NULL && ref->path[0] != 0) {
	indx = 0;
	/*
	 * Ensure the path includes a '/'
	 */
	if ((out == 0) && (bas->server != NULL))
	    res->path[out++] = '/';
	while (ref->path[indx] != 0) {
	    res->path[out++] = ref->path[indx++];
	}
    }
    res->path[out] = 0;

    /*
     * Steps c) to h) are really path normalization steps
     */
    xmlNormalizeURIPath(res->path);

step_7:

    /*
     * 7) The resulting URI components, including any inherited from the
     *    base URI, are recombined to give the absolute form of the URI
     *    reference.
     */
    val = xmlSaveUri(res);

done:
    if (ref != NULL)
	xmlFreeURI(ref);
    if (bas != NULL)
	xmlFreeURI(bas);
    if (res != NULL)
	xmlFreeURI(res);
    return(val);
}